

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NussinovAlgorithm.cpp
# Opt level: O0

int __thiscall NussinovAlgorithm::get_nbp(NussinovAlgorithm *this,int i,int j)

{
  int iVar1;
  char *pcVar2;
  int k;
  int count;
  string bp;
  int in_stack_000000f0;
  int in_stack_000000f4;
  NussinovAlgorithm *in_stack_000000f8;
  int local_38;
  int local_34;
  string local_30 [48];
  
  get_bp_abi_cxx11_(in_stack_000000f8,in_stack_000000f4,in_stack_000000f0);
  local_34 = 0;
  local_38 = 0;
  while( true ) {
    iVar1 = std::__cxx11::string::size();
    if (iVar1 <= local_38) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    if (*pcVar2 == '(') {
      local_34 = local_34 + 1;
    }
    local_38 = local_38 + 1;
  }
  std::__cxx11::string::~string(local_30);
  return local_34;
}

Assistant:

int NussinovAlgorithm::get_nbp(int i, int j) {
    string bp = get_bp(i,j);
    int count = 0;
    for (int k = 0; k < (int)bp.size(); k++) {
        if (bp[k] == '(') count++;
    }
    return count;
}